

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  int mn;
  int iVar4;
  int local_50;
  int local_4c;
  int end;
  int start;
  ImVec2 pos;
  ImRect unclipped_rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  int *out_items_display_end_local;
  int *out_items_display_start_local;
  float items_height_local;
  int items_count_local;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) == 0) {
    if ((pIVar1->SkipItems & 1U) == 0) {
      pos = (pIVar1->ClipRect).Min;
      IVar2 = (pIVar1->ClipRect).Max;
      if ((GImGui->NavMoveRequest & 1U) != 0) {
        ImRect::Add((ImRect *)&pos,&GImGui->NavScoringRectScreen);
      }
      start = (int)(pIVar1->DC).CursorPos.y;
      local_4c = (int)((pos.y - (float)start) / items_height);
      unclipped_rect.Min.y = IVar2.y;
      local_50 = (int)((unclipped_rect.Min.y - (float)start) / items_height);
      if (((pIVar3->NavMoveRequest & 1U) != 0) && (pIVar3->NavMoveClipDir == 2)) {
        local_4c = local_4c + -1;
      }
      if (((pIVar3->NavMoveRequest & 1U) != 0) && (pIVar3->NavMoveClipDir == 3)) {
        local_50 = local_50 + 1;
      }
      mn = ImClamp<int>(local_4c,0,items_count);
      iVar4 = ImClamp<int>(local_50 + 1,mn,items_count);
      *out_items_display_start = mn;
      *out_items_display_end = iVar4;
    }
    else {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
    }
  }
  else {
    *out_items_display_start = 0;
    *out_items_display_end = items_count;
  }
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRectScreen);

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}